

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  undefined1 auVar1 [16];
  wchar_t wVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  wchar_t *pwVar8;
  int *__s;
  unsigned_long *puVar9;
  long lVar10;
  size_t __n;
  wchar_t *pwVar11;
  undefined1 auVar12 [16];
  undefined1 local_48 [16];
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  do {
    wVar2 = *flags;
    uVar6 = (ulong)(uint)wVar2;
    if (wVar2 < L' ') {
      if (wVar2 != L'\t') {
        if (wVar2 == L'\0') {
          local_48 = (undefined1  [16])0x0;
          pwVar8 = (wchar_t *)0x0;
          goto LAB_003a4510;
        }
LAB_003a43f7:
        local_48 = (undefined1  [16])0x0;
        pwVar8 = (wchar_t *)0x0;
        do {
          lVar10 = 0;
          while ((0x2c < (uint)uVar6 || ((0x100100000201U >> (uVar6 & 0x3f) & 1) == 0))) {
            lVar4 = lVar10 + 4;
            lVar10 = lVar10 + 4;
            uVar6 = (ulong)*(uint *)((long)flags + lVar4);
          }
          pwVar11 = (wchar_t *)((long)flags + lVar10);
          __n = lVar10 >> 2;
          puVar9 = &::flags[0].set;
          __s = anon_var_dwarf_156647b;
          do {
            sVar7 = wcslen(__s);
            if ((__n == sVar7) && (iVar5 = wmemcmp(flags,__s,__n), iVar5 == 0)) {
              auVar1 = *(undefined1 (*) [16])puVar9;
              auVar12._0_8_ = auVar1._8_8_;
              auVar12._8_4_ = auVar1._0_4_;
              auVar12._12_4_ = auVar1._4_4_;
LAB_003a44c1:
              local_48 = local_48 | auVar12;
              bVar3 = false;
              goto LAB_003a44e2;
            }
            if ((__n == sVar7 - 2) && (iVar5 = wmemcmp(flags,__s + 2,__n), iVar5 == 0)) {
              auVar12 = *(undefined1 (*) [16])puVar9;
              goto LAB_003a44c1;
            }
            __s = *(int **)(*(undefined1 (*) [16])(puVar9 + 2) + 8);
            puVar9 = puVar9 + 4;
          } while (__s != (wchar_t *)0x0);
          bVar3 = true;
LAB_003a44e2:
          while( true ) {
            uVar6 = (ulong)(uint)*pwVar11;
            if ((0x2c < uVar6) || ((0x100100000200U >> (uVar6 & 0x3f) & 1) == 0)) break;
            pwVar11 = pwVar11 + 1;
          }
          if (pwVar8 != (wchar_t *)0x0) {
            flags = pwVar8;
          }
          if (bVar3) {
            pwVar8 = flags;
          }
          flags = pwVar11;
        } while (*pwVar11 != L'\0');
LAB_003a4510:
        entry->ae_fflags_set = local_48._0_8_;
        entry->ae_fflags_clear = local_48._8_8_;
        return pwVar8;
      }
    }
    else if ((wVar2 != L' ') && (wVar2 != L',')) goto LAB_003a43f7;
    flags = flags + 1;
  } while( true );
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}